

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiclock.cpp
# Opt level: O0

bool choosePort<RtMidiOut>(RtMidiOut *rtmidi,char *dir)

{
  uint uVar1;
  ostream *poVar2;
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  undefined4 local_58;
  uint local_48;
  uint local_44;
  uint nPorts;
  uint i;
  string portName;
  char *dir_local;
  RtMidiOut *rtmidi_local;
  
  portName.field_2._8_8_ = dir;
  std::__cxx11::string::string((string *)&nPorts);
  local_44 = 0;
  local_48 = (**(code **)(*(long *)rtmidi + 0x10))();
  if (local_48 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No ");
    poVar2 = std::operator<<(poVar2,(char *)portName.field_2._8_8_);
    poVar2 = std::operator<<(poVar2," ports available!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    rtmidi_local._7_1_ = false;
  }
  else {
    if (local_48 == 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\nOpening ");
      (**(code **)(*(long *)rtmidi + 0x18))(local_78,rtmidi,0);
      poVar2 = std::operator<<(poVar2,local_78);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_78);
    }
    else {
      for (local_44 = 0; local_44 < local_48; local_44 = local_44 + 1) {
        (**(code **)(*(long *)rtmidi + 0x18))(local_98,rtmidi,local_44);
        std::__cxx11::string::operator=((string *)&nPorts,local_98);
        std::__cxx11::string::~string(local_98);
        poVar2 = std::operator<<((ostream *)&std::cout,"  ");
        poVar2 = std::operator<<(poVar2,(char *)portName.field_2._8_8_);
        poVar2 = std::operator<<(poVar2," port #");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_44);
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = std::operator<<(poVar2,(string *)&nPorts);
        std::operator<<(poVar2,'\n');
      }
      do {
        std::operator<<((ostream *)&std::cout,"\nChoose a port number: ");
        std::istream::operator>>((istream *)&std::cin,&local_44);
      } while (local_48 <= local_44);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    uVar1 = local_44;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b8,"RtMidi Output",&local_b9);
    (*(code *)**(undefined8 **)rtmidi)(rtmidi,uVar1,local_b8);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator(&local_b9);
    rtmidi_local._7_1_ = true;
  }
  local_58 = 1;
  std::__cxx11::string::~string((string *)&nPorts);
  return rtmidi_local._7_1_;
}

Assistant:

bool choosePort( RT *rtmidi, const char *dir )
{
  std::string portName;
  unsigned int i = 0, nPorts = rtmidi->getPortCount();
  if ( nPorts == 0 ) {
    std::cout << "No " << dir << " ports available!" << std::endl;
    return false;
  }

  if ( nPorts == 1 ) {
    std::cout << "\nOpening " << rtmidi->getPortName() << std::endl;
  }
  else {
    for ( i=0; i<nPorts; i++ ) {
      portName = rtmidi->getPortName(i);
      std::cout << "  " << dir << " port #" << i << ": " << portName << '\n';
    }

    do {
      std::cout << "\nChoose a port number: ";
      std::cin >> i;
    } while ( i >= nPorts );
  }

  std::cout << "\n";
  rtmidi->openPort( i );

  return true;
}